

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::StringMaker<std::vector<int,_std::allocator<int>_>_>::convert
                   (String *__return_storage_ptr__,vector<int,_std::allocator<int>_> *in)

{
  pointer in_00;
  ostringstream oss;
  anon_union_24_2_13149d16_for_String_2 local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"[");
  in_00 = (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  while (in_00 != (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
    detail::StringMakerBase<true>::convert<int>((String *)&local_1c8.data,in_00);
    doctest::operator<<((ostream *)local_1a8,(String *)&local_1c8.data);
    in_00 = in_00 + 1;
    String::~String((String *)&local_1c8.data);
    if (in_00 != (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                 ._M_finish) {
      std::operator<<((ostream *)local_1a8,", ");
    }
  }
  std::operator<<((ostream *)local_1a8,"]");
  std::__cxx11::stringbuf::str();
  String::String(__return_storage_ptr__,local_1c8.data.ptr);
  std::__cxx11::string::~string((string *)&local_1c8.data);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static String convert(const std::vector<T>& in)
  {
    std::ostringstream oss;

    oss << "[";
    for (auto it = in.begin(); it != in.end();)
    {
      oss << StringMaker<T>::convert(*it++);
      if (it != in.end()) { oss << ", "; }
    }
    oss << "]";

    return oss.str().c_str();
  }